

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::execution_is_noop(Compiler *this,SPIRBlock *from,SPIRBlock *to)

{
  bool bVar1;
  uint32_t uVar2;
  
  bVar1 = execution_is_branchless(this,from,to);
  if (bVar1) {
    bVar1 = true;
    uVar2 = (from->super_IVariant).self.id;
    while (uVar2 != (to->super_IVariant).self.id) {
      bVar1 = block_is_noop(this,from);
      if (!bVar1) {
        return bVar1;
      }
      from = Variant::get<spirv_cross::SPIRBlock>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        (from->next_block).id);
      uVar2 = (from->super_IVariant).self.id;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Compiler::execution_is_noop(const SPIRBlock &from, const SPIRBlock &to) const
{
	if (!execution_is_branchless(from, to))
		return false;

	auto *start = &from;
	for (;;)
	{
		if (start->self == to.self)
			return true;

		if (!block_is_noop(*start))
			return false;

		auto &next = get<SPIRBlock>(start->next_block);
		start = &next;
	}
}